

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O1

void __thiscall
pfederc::Capabilities::Capabilities
          (Capabilities *this,bool isunused,bool isinline,bool isconstant,
          vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
          *required,
          vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
          *ensures)

{
  this->isunused = isunused;
  this->isinline = isinline;
  this->isconstant = isconstant;
  (this->required).
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (required->
       super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->required).
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (required->
       super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  (this->required).
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (required->
       super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (required->
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (required->
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (required->
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ensures).
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (ensures->
       super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->ensures).
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (ensures->
       super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  (this->ensures).
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (ensures->
       super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (ensures->
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (ensures->
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (ensures->
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

Capabilities::Capabilities(bool isunused, bool isinline, bool isconstant,
    std::vector<std::unique_ptr<Expr>> &&required,
    std::vector<std::unique_ptr<Expr>> &&ensures) noexcept
    : isunused{isunused}, isinline{isinline}, isconstant{isconstant},
      required(std::move(required)), ensures(std::move(ensures)) {}